

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_encoder.cc
# Opt level: O0

Status * __thiscall draco::StlEncoder::EncodeInternal(StlEncoder *this)

{
  bool bVar1;
  DataType DVar2;
  ostream *poVar3;
  PointAttribute *pPVar4;
  VectorD<float,_3> *u;
  StlEncoder *in_RSI;
  Status *in_RDI;
  int c;
  Vector3f norm;
  Vector3f pos [3];
  PointAttribute *pos_att;
  Face *f;
  FaceIndex i;
  uint16_t unused;
  int pos_att_id;
  vector<unsigned_char,_std::allocator<unsigned_char>_> stl_face;
  uint32_t num_faces;
  string header_str;
  stringstream out;
  undefined4 in_stack_fffffffffffffc08;
  Type in_stack_fffffffffffffc0c;
  PointCloud *in_stack_fffffffffffffc10;
  PointAttribute *in_stack_fffffffffffffc18;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffc20;
  AttributeValueIndex att_index;
  PointAttribute *in_stack_fffffffffffffc28;
  undefined4 in_stack_fffffffffffffc30;
  AttributeValueIndex in_stack_fffffffffffffc34;
  EncoderBuffer *in_stack_fffffffffffffc38;
  allocator<char> *in_stack_fffffffffffffc40;
  char *in_stack_fffffffffffffc48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc50;
  undefined1 *local_368;
  int local_2bc;
  undefined1 local_288 [36];
  undefined1 auStack_264 [4];
  PointAttribute *local_260;
  uint local_254;
  Face *local_250;
  ValueType local_244;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> local_240;
  undefined2 local_23c;
  allocator<char> local_239;
  string local_238 [32];
  undefined4 local_218;
  allocator<char> local_211;
  string local_210 [36];
  int32_t local_1ec;
  ValueType local_1cc;
  string local_1c8 [32];
  int local_1a8;
  stringstream local_198 [16];
  undefined1 local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar3 = (ostream *)std::ostream::operator<<(local_188,std::left);
  local_1a8 = (int)std::setw(0x50);
  poVar3 = std::operator<<(poVar3,(_Setw)local_1a8);
  std::operator<<(poVar3,"generated using Draco");
  std::__cxx11::stringstream::str();
  buffer(in_RSI);
  std::__cxx11::string::data();
  std::__cxx11::string::length();
  EncoderBuffer::Encode
            (in_stack_fffffffffffffc38,
             (void *)CONCAT44(in_stack_fffffffffffffc34.value_,in_stack_fffffffffffffc30),
             (size_t)in_stack_fffffffffffffc28);
  local_1cc = Mesh::num_faces((Mesh *)0x14f22d);
  buffer(in_RSI);
  EncoderBuffer::Encode
            (in_stack_fffffffffffffc38,
             (void *)CONCAT44(in_stack_fffffffffffffc34.value_,in_stack_fffffffffffffc30),
             (size_t)in_stack_fffffffffffffc28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x14f284);
  local_1ec = PointCloud::GetNamedAttributeId(in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c);
  if (local_1ec < 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
    ErrorStatus((string *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
    std::__cxx11::string::~string(local_210);
    std::allocator<char>::~allocator(&local_211);
  }
  else {
    pPVar4 = PointCloud::attribute(in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c);
    DVar2 = GeometryAttribute::data_type(&pPVar4->super_GeometryAttribute);
    if (DVar2 == DT_FLOAT32) {
      local_23c = 0;
      if (in_RSI->in_mesh_ != (Mesh *)0x0) {
        IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::IndexType(&local_240,0);
        while( true ) {
          local_244 = Mesh::num_faces((Mesh *)0x14f50a);
          bVar1 = IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator<
                            (&local_240,&local_244);
          if (!bVar1) break;
          local_254 = local_240.value_;
          local_250 = Mesh::face((Mesh *)CONCAT44(in_stack_fffffffffffffc0c,
                                                  in_stack_fffffffffffffc08),
                                 (FaceIndex)(uint)((ulong)in_stack_fffffffffffffc10 >> 0x20));
          local_260 = PointCloud::attribute(in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c);
          local_368 = local_288;
          do {
            VectorD<float,_3>::VectorD((VectorD<float,_3> *)in_stack_fffffffffffffc10);
            local_368 = local_368 + 0xc;
          } while (local_368 != auStack_264);
          std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>::operator[]
                    ((array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL> *)
                     in_stack_fffffffffffffc10,
                     CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
          VectorD<float,_3>::operator[]
                    ((VectorD<float,_3> *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c);
          PointAttribute::GetMappedValue
                    (in_stack_fffffffffffffc18,
                     (PointIndex)(uint)((ulong)in_stack_fffffffffffffc20 >> 0x20),
                     in_stack_fffffffffffffc10);
          std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>::operator[]
                    ((array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL> *)
                     in_stack_fffffffffffffc10,
                     CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
          VectorD<float,_3>::operator[]
                    ((VectorD<float,_3> *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c);
          PointAttribute::GetMappedValue
                    (in_stack_fffffffffffffc18,
                     (PointIndex)(uint)((ulong)in_stack_fffffffffffffc20 >> 0x20),
                     in_stack_fffffffffffffc10);
          pPVar4 = local_260;
          std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>::operator[]
                    ((array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL> *)
                     in_stack_fffffffffffffc10,
                     CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
          u = (VectorD<float,_3> *)
              VectorD<float,_3>::operator[]
                        ((VectorD<float,_3> *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc0c);
          PointAttribute::GetMappedValue
                    (in_stack_fffffffffffffc18,
                     (PointIndex)(uint)((ulong)in_stack_fffffffffffffc20 >> 0x20),
                     in_stack_fffffffffffffc10);
          VectorD<float,_3>::operator-
                    ((VectorD<float,_3> *)in_stack_fffffffffffffc38,
                     (Self *)CONCAT44(in_stack_fffffffffffffc34.value_,in_stack_fffffffffffffc30));
          VectorD<float,_3>::operator-
                    ((VectorD<float,_3> *)in_stack_fffffffffffffc38,
                     (Self *)CONCAT44(in_stack_fffffffffffffc34.value_,in_stack_fffffffffffffc30));
          CrossProduct<float>(u,(VectorD<float,_3> *)pPVar4);
          VectorD<float,_3>::Normalize((VectorD<float,_3> *)in_stack_fffffffffffffc20);
          buffer(in_RSI);
          VectorD<float,_3>::data((VectorD<float,_3> *)0x14f7ac);
          EncoderBuffer::Encode
                    (in_stack_fffffffffffffc38,
                     (void *)CONCAT44(in_stack_fffffffffffffc34.value_,in_stack_fffffffffffffc30),
                     (size_t)in_stack_fffffffffffffc28);
          for (local_2bc = 0; local_2bc < 3; local_2bc = local_2bc + 1) {
            in_stack_fffffffffffffc38 = buffer(in_RSI);
            att_index.value_ = (uint)((ulong)in_stack_fffffffffffffc20 >> 0x20);
            in_stack_fffffffffffffc28 = local_260;
            std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>::operator[]
                      ((array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL> *)
                       in_stack_fffffffffffffc10,
                       CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
            in_stack_fffffffffffffc34 =
                 PointAttribute::mapped_index
                           ((PointAttribute *)
                            CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08),
                            (uint)in_stack_fffffffffffffc10);
            in_stack_fffffffffffffc20 =
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 GeometryAttribute::GetAddress
                           (&in_stack_fffffffffffffc18->super_GeometryAttribute,att_index);
            in_stack_fffffffffffffc18 =
                 (PointAttribute *)
                 GeometryAttribute::byte_stride(&local_260->super_GeometryAttribute);
            EncoderBuffer::Encode
                      (in_stack_fffffffffffffc38,
                       (void *)CONCAT44(in_stack_fffffffffffffc34.value_,in_stack_fffffffffffffc30),
                       (size_t)in_stack_fffffffffffffc28);
          }
          in_stack_fffffffffffffc10 = (PointCloud *)buffer(in_RSI);
          EncoderBuffer::Encode
                    (in_stack_fffffffffffffc38,
                     (void *)CONCAT44(in_stack_fffffffffffffc34.value_,in_stack_fffffffffffffc30),
                     (size_t)in_stack_fffffffffffffc28);
          IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator++(&local_240);
        }
      }
      OkStatus();
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
      ErrorStatus((string *)CONCAT44(in_stack_fffffffffffffc0c,in_stack_fffffffffffffc08));
      std::__cxx11::string::~string(local_238);
      std::allocator<char>::~allocator(&local_239);
    }
  }
  local_218 = 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_fffffffffffffc20);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

Status StlEncoder::EncodeInternal() {
  // Write STL header.
  std::stringstream out;
  out << std::left << std::setw(80)
      << "generated using Draco";  // header is 80 bytes fixed size.
  const std::string header_str = out.str();
  buffer()->Encode(header_str.data(), header_str.length());

  uint32_t num_faces = in_mesh_->num_faces();
  buffer()->Encode(&num_faces, 4);

  std::vector<uint8_t> stl_face;

  const int pos_att_id =
      in_mesh_->GetNamedAttributeId(GeometryAttribute::POSITION);

  if (pos_att_id < 0) {
    return ErrorStatus("Mesh is missing the position attribute.");
  }

  if (in_mesh_->attribute(pos_att_id)->data_type() != DT_FLOAT32) {
    return ErrorStatus("Mesh position attribute is not of type float32.");
  }

  uint16_t unused = 0;

  if (in_mesh_) {
    for (FaceIndex i(0); i < in_mesh_->num_faces(); ++i) {
      const auto &f = in_mesh_->face(i);
      const auto *const pos_att = in_mesh_->attribute(pos_att_id);

      // The normal attribute can contain arbitrary normals that may not
      // correspond to the winding of the face.
      // Therefor we simply always calculate them
      // using the points of the triangle face: norm(cross(p2-p1, p3-p1))

      Vector3f pos[3];
      pos_att->GetMappedValue(f[0], &pos[0][0]);
      pos_att->GetMappedValue(f[1], &pos[1][0]);
      pos_att->GetMappedValue(f[2], &pos[2][0]);
      Vector3f norm = CrossProduct(pos[1] - pos[0], pos[2] - pos[0]);
      norm.Normalize();
      buffer()->Encode(norm.data(), sizeof(float) * 3);

      for (int c = 0; c < 3; ++c) {
        buffer()->Encode(pos_att->GetAddress(pos_att->mapped_index(f[c])),
                         pos_att->byte_stride());
      }

      buffer()->Encode(&unused, 2);
    }
  }
  return OkStatus();
}